

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_dist_wtd_convolve_y_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int16_t *piVar4;
  CONV_BUF_TYPE *pCVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  int k;
  ulong uVar19;
  int iVar20;
  
  cVar6 = (char)conv_params->round_0;
  cVar9 = cVar6 + (char)conv_params->round_1;
  uVar2 = filter_params_y->taps;
  iVar20 = (1 << (0x15U - cVar9 & 0x1f)) + (1 << (0x16U - cVar9 & 0x1f));
  piVar4 = filter_params_y->filter_ptr;
  uVar12 = (ulong)(uint)w;
  if (w < 1) {
    uVar12 = 0;
  }
  uVar13 = (ulong)(uint)h;
  if (h < 1) {
    uVar13 = 0;
  }
  lVar11 = (long)src_stride;
  pbVar17 = src + (1 - (ulong)(uVar2 >> 1)) * lVar11;
  pCVar5 = conv_params->dst;
  iVar3 = conv_params->dst_stride;
  for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
    lVar8 = uVar14 * (long)iVar3;
    pbVar18 = pbVar17;
    for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
      iVar16 = 0;
      pbVar15 = pbVar18;
      for (uVar19 = 0; filter_params_y->taps != uVar19; uVar19 = uVar19 + 1) {
        iVar16 = iVar16 + (uint)*pbVar15 *
                          (int)*(short *)((long)piVar4 +
                                         uVar19 * 2 +
                                         (ulong)((subpel_y_qn & 0xfU) * (uint)uVar2 * 2));
        pbVar15 = pbVar15 + lVar11;
      }
      bVar1 = (byte)conv_params->round_1;
      iVar16 = (((1 << (bVar1 & 0x1f)) >> 1) + (iVar16 << (7U - cVar6 & 0x1f)) >> (bVar1 & 0x1f)) +
               iVar20;
      if (conv_params->do_average == 0) {
        pCVar5[lVar8 + uVar10] = (CONV_BUF_TYPE)iVar16;
      }
      else {
        uVar7 = (uint)pCVar5[lVar8 + uVar10];
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          iVar16 = (int)(iVar16 + uVar7) >> 1;
        }
        else {
          iVar16 = (int)(iVar16 * conv_params->bck_offset + uVar7 * conv_params->fwd_offset) >> 4;
        }
        iVar16 = iVar16 + (((1 << (0xeU - cVar9 & 0x1f)) >> 1) - iVar20) >> (0xeU - cVar9 & 0x1f);
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        if (0xfe < iVar16) {
          iVar16 = 0xff;
        }
        dst[uVar10 + uVar14 * (long)dst_stride] = (uint8_t)iVar16;
      }
      pbVar18 = pbVar18 + 1;
    }
    pbVar17 = pbVar17 + lVar11;
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_c(const uint8_t *src, int src_stride, uint8_t *dst,
                               int dst_stride, int w, int h,
                               const InterpFilterParams *filter_params_y,
                               const int subpel_y_qn,
                               ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      res *= (1 << bits);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_1) + round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}